

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O0

void __thiscall FIX43::Message::Message(Message *this,MsgType *msgtype)

{
  allocator<char> local_91;
  STRING local_90;
  BeginString local_70;
  MsgType *local_18;
  MsgType *msgtype_local;
  Message *this_local;
  
  local_18 = msgtype;
  msgtype_local = (MsgType *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"FIX.4.3",&local_91);
  FIX::BeginString::BeginString(&local_70,&local_90);
  FIX::Message::Message(&this->super_Message,&local_70,local_18);
  FIX::BeginString::~BeginString(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  *(undefined ***)this = &PTR__Message_0017c938;
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIX.4.3"), msgtype )
     {}